

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit.cc
# Opt level: O2

void ResourceConsumingWorker(void)

{
  bool bVar1;
  long in_RAX;
  ostream *poVar2;
  long lVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  
  local_28.__r = in_RAX;
  for (lVar3 = 0; lVar3 != 100; lVar3 = lVar3 + 1) {
    bVar1 = LimitEffort::ShouldContinue();
    if (!bVar1) break;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar3);
    std::operator<<(poVar2,' ');
    LimitEffort::Consume((int)lVar3);
    local_28.__r = lVar3;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_28);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void ResourceConsumingWorker() {
  for (int i = 0; i < 100 && LimitEffort::ShouldContinue(); ++i) {
    std::cerr << i << ' ';
    LimitEffort::Consume(i);
    std::this_thread::sleep_for(std::chrono::milliseconds(i));
  }
  std::cerr << std::endl;
}